

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O3

double lf::assemble::test::test_vec_lr_mult(Mesh *mesh,DofHandler *dof_handler)

{
  double val2;
  double *pdVar1;
  Index IVar2;
  ReturnType val1;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  char *message;
  long lVar8;
  VectorXd vec;
  SparseMatrix<double,_0,_int> A;
  MVMultAssembler assembler;
  scalar_product_op<double,_double> local_1d9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1d8;
  ReturnType local_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [8];
  RhsNested pSStack_190;
  RhsNested local_188;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_0,_int>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_178;
  Lhs local_158;
  SparseMatrix<double,_0,_int> local_148;
  Lhs local_100;
  Lhs local_f8;
  undefined1 *local_e8;
  undefined1 local_e0 [8];
  MVMultAssembler local_d8;
  
  uVar5 = (*dof_handler->_vptr_DofHandler[2])(dof_handler);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," degrees of freedom",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_d8,(ulong)uVar5,1,(scalar_random_op<double> *)&local_148);
  local_1d8.m_storage.m_data = (double *)0x0;
  local_1d8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_1d8,(Index)local_d8.mesh_,1);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1d8,
             (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_d8,(assign_op<double,_double> *)&local_148);
  IVar2 = local_1d8.m_storage.m_rows;
  pdVar1 = local_1d8.m_storage.m_data;
  if (0 < local_1d8.m_storage.m_rows) {
    lVar8 = 0;
    do {
      iVar6 = rand();
      pdVar1[lVar8] = ((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0;
      lVar8 = lVar8 + 1;
    } while (IVar2 != lVar8);
  }
  local_d8.mat_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.m_rows = 0;
  local_d8.mat_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>.m_storage.m_cols = 0;
  local_1b8._4_4_ = uVar5;
  local_1b8._0_4_ = uVar5;
  local_1b8._8_8_ = (pointer)0x0;
  local_1b8._16_8_ = (pointer)0x0;
  local_1b8._24_8_ = (pointer)0x0;
  local_d8.mesh_ = mesh;
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::assemble::test::MVMultAssembler>
            ((COOMatrix<double> *)&local_148,0,dof_handler,dof_handler,&local_d8);
  uVar4 = local_1b8._24_8_;
  uVar3 = local_1b8._8_8_;
  local_1b8._0_8_ = local_148._0_8_;
  local_1b8._8_8_ = local_148.m_outerSize;
  local_1b8._16_8_ = local_148.m_innerSize;
  local_1b8._24_8_ = local_148.m_outerIndex;
  local_148.m_outerSize = 0;
  local_148.m_innerSize = 0;
  local_148.m_outerIndex = (StorageIndex *)0x0;
  if ((pointer)uVar3 != (pointer)0x0) {
    operator_delete((void *)uVar3,uVar4 - uVar3);
    if ((void *)local_148.m_outerSize != (void *)0x0) {
      operator_delete((void *)local_148.m_outerSize,
                      (long)local_148.m_outerIndex - local_148.m_outerSize);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Assembled ",10);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," matrix",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  COOMatrix<double>::makeSparse(&local_148,(COOMatrix<double> *)local_1b8);
  Eigen::Product<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
  Product((Product<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *
          )local_198,&local_148,(Rhs *)&local_1d8);
  local_178.m_lhs.m_lhs.m_matrix = (non_const_type)CONCAT71(local_198._1_7_,local_198[0]);
  local_178.m_lhs.m_rhs = pSStack_190;
  local_1c0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
              dot<Eigen::Product<Eigen::SparseMatrix<double,0,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                        ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_1d8,
                         (MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                          *)&local_178);
  local_100.m_matrix = (non_const_type)&local_1d8;
  Eigen::
  Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::SparseMatrix<double,_0,_int>,_0>
  ::Product((Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_0,_int>,_0>
             *)local_198,&local_100,&local_148);
  local_f8.m_rhs = pSStack_190;
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::SparseMatrix<double,_0,_int>,_0>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
  ::Product(&local_178,&local_f8,(Rhs *)&local_1d8);
  local_e8 = local_e0;
  local_158.m_matrix.m_lhs.m_matrix = local_178.m_lhs.m_lhs.m_matrix;
  local_158.m_matrix.m_rhs = local_178.m_lhs.m_rhs;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::SparseMatrix<double,_0,_int>,_0>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_0,_int>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)local_198,&local_158,local_178.m_rhs,&local_1d9);
  if ((local_188->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      != 0) {
    Eigen::
    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::SparseMatrix<double,0,int>,0>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::redux<Eigen::internal::scalar_sum_op<double,double>>
              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::SparseMatrix<double,0,int>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                *)local_198,(scalar_sum_op<double,_double> *)&local_1d9);
  }
  val2 = multVecAssMat<double,lf::assemble::test::MVMultAssembler>
                   (0,dof_handler,&local_d8,(Matrix<double,__1,_1,_0,__1,_1> *)&local_1d8);
  val1 = local_1c0;
  local_1c0 = val2;
  testing::internal::DoubleNearPredFormat((internal *)local_198,"s1","s2","1.0E-9",val1,val2,1e-09);
  if (local_198[0] ==
      (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::SparseMatrix<double,0,int>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
       )0x0) {
    testing::Message::Message((Message *)&local_178);
    if (pSStack_190 == (RhsNested)0x0) {
      message = "";
    }
    else {
      message = *(char **)pSStack_190;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
               ,700,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if (local_178.m_lhs.m_lhs.m_matrix != (non_const_type)0x0) {
      (*(code *)((local_178.m_lhs.m_lhs.m_matrix)->
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[1])
                ();
    }
  }
  if (pSStack_190 != (RhsNested)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pSStack_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSStack_190);
  }
  free(local_148.m_outerIndex);
  free(local_148.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_148.m_data);
  if ((pointer)local_1b8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._8_8_,local_1b8._24_8_ - local_1b8._8_8_);
  }
  free(local_1d8.m_storage.m_data);
  return local_1c0;
}

Assistant:

double test_vec_lr_mult(const lf::mesh::Mesh &mesh,
                        const lf::assemble::DofHandler &dof_handler) {
  const lf::assemble::size_type N_dofs(dof_handler.NumDofs());
  std::cout << N_dofs << " degrees of freedom" << std::endl;
  // A random vector
  Eigen::VectorXd vec = Eigen::VectorXd::Random(N_dofs);

  // Dummy assembler
  MVMultAssembler assembler{mesh};
  lf::assemble::COOMatrix<double> mat(N_dofs, N_dofs);
  mat = lf::assemble::AssembleMatrixLocally<lf::assemble::COOMatrix<double>>(
      0, dof_handler, assembler);
  std::cout << "Assembled " << mat.rows() << "x" << mat.cols() << " matrix"
            << std::endl;
  // Build sparse matrix from COO format
  Eigen::SparseMatrix<double> A = mat.makeSparse();
  // Compute product of matrix with vector from left and right
  double s1 = vec.dot(A * vec);
  double s1_alt = vec.transpose() * A * vec;

  // Alternative way to comput product
  double s2 = multVecAssMat<double, decltype(assembler)>(0, dof_handler,
                                                         assembler, vec);

  EXPECT_NEAR(s1, s2, 1.0E-9);
  return s2;
}